

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O2

Matrix<double,_3,_3> *
math::matrix_inverse<double>
          (Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *m,double *det)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 local_58 [8];
  Matrix<double,_3,_3> ret;
  
  dVar1 = m->m[8];
  dVar2 = m->m[4];
  dVar3 = m->m[5];
  dVar4 = m->m[7];
  local_58 = (undefined1  [8])(dVar2 * dVar1 - dVar4 * dVar3);
  dVar5 = m->m[1];
  dVar6 = m->m[2];
  ret.m[0] = dVar6 * dVar4 - dVar1 * dVar5;
  ret.m[1] = dVar5 * dVar3 - dVar2 * dVar6;
  dVar7 = m->m[3];
  dVar8 = m->m[6];
  ret.m[2] = dVar3 * dVar8 - dVar1 * dVar7;
  dVar9 = m->m[0];
  ret.m[3] = dVar1 * dVar9 - dVar8 * dVar6;
  ret.m[4] = dVar6 * dVar7 - dVar3 * dVar9;
  ret.m[5] = dVar7 * dVar4 - dVar8 * dVar2;
  ret.m[6] = dVar5 * dVar8 - dVar4 * dVar9;
  ret.m[7] = dVar9 * dVar2 - dVar7 * dVar5;
  Matrix<double,_3,_3>::operator/(__return_storage_ptr__,(Matrix<double,_3,_3> *)local_58,det);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T,3,3>
matrix_inverse (Matrix<T,3,3> const& m, T const& det)
{
    Matrix<T,3,3> ret;
    ret[0] = m[4] * m[8] - m[5] * m[7];
    ret[1] = m[2] * m[7] - m[1] * m[8];
    ret[2] = m[1] * m[5] - m[2] * m[4];
    ret[3] = m[5] * m[6] - m[3] * m[8];
    ret[4] = m[0] * m[8] - m[2] * m[6];
    ret[5] = m[2] * m[3] - m[0] * m[5];
    ret[6] = m[3] * m[7] - m[4] * m[6];
    ret[7] = m[1] * m[6] - m[0] * m[7];
    ret[8] = m[0] * m[4] - m[1] * m[3];
    return ret / det;
}